

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O1

SQBool sqstd_rex_matchcclass(SQInteger cclass,SQChar c)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  
  bVar1 = false;
  bVar3 = bVar1;
  if (cclass < 99) {
    if (cclass < 0x50) {
      if (cclass == 0x41) {
        iVar2 = isalpha((int)c);
      }
      else {
        if (cclass != 0x43) {
          if (cclass == 0x44) {
            bVar3 = (int)c - 0x3aU < 0xfffffff6;
          }
          goto switchD_0010890e_caseD_51;
        }
        iVar2 = iscntrl((int)c);
      }
      goto LAB_00108a28;
    }
    bVar3 = false;
    switch(cclass) {
    case 0x50:
      iVar2 = ispunct((int)c);
      break;
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
    case 0x56:
      goto switchD_0010890e_caseD_51;
    case 0x53:
      iVar2 = isspace((int)c);
      break;
    case 0x57:
      iVar2 = isalnum((int)c);
      bVar3 = c != '_' && iVar2 == 0;
      goto switchD_0010890e_caseD_51;
    case 0x58:
      iVar2 = isxdigit((int)c);
      break;
    default:
      bVar3 = bVar1;
      if (cclass != 0x61) goto switchD_0010890e_caseD_51;
      iVar2 = isalpha((int)c);
      goto LAB_00108a37;
    }
LAB_00108a28:
    bVar3 = iVar2 == 0;
    goto switchD_0010890e_caseD_51;
  }
  switch(cclass) {
  case 0x6c:
    iVar2 = islower((int)c);
    break;
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
    goto switchD_0010890e_caseD_51;
  case 0x70:
    iVar2 = ispunct((int)c);
    break;
  case 0x73:
    iVar2 = isspace((int)c);
    break;
  case 0x75:
    iVar2 = isupper((int)c);
    break;
  case 0x77:
    iVar2 = isalnum((int)c);
    bVar3 = c == '_' || iVar2 != 0;
    goto switchD_0010890e_caseD_51;
  case 0x78:
    iVar2 = isxdigit((int)c);
    break;
  default:
    if (cclass != 99) {
      if (cclass == 100) {
        bVar3 = (int)c - 0x30U < 10;
      }
      goto switchD_0010890e_caseD_51;
    }
    iVar2 = iscntrl((int)c);
  }
LAB_00108a37:
  bVar3 = iVar2 != 0;
switchD_0010890e_caseD_51:
  return (ulong)bVar3;
}

Assistant:

static SQBool sqstd_rex_matchcclass(SQInteger cclass,SQChar c)
{
    switch(cclass) {
    case 'a': return isalpha(c)?SQTrue:SQFalse;
    case 'A': return !isalpha(c)?SQTrue:SQFalse;
    case 'w': return (isalnum(c) || c == '_')?SQTrue:SQFalse;
    case 'W': return (!isalnum(c) && c != '_')?SQTrue:SQFalse;
    case 's': return isspace(c)?SQTrue:SQFalse;
    case 'S': return !isspace(c)?SQTrue:SQFalse;
    case 'd': return isdigit(c)?SQTrue:SQFalse;
    case 'D': return !isdigit(c)?SQTrue:SQFalse;
    case 'x': return isxdigit(c)?SQTrue:SQFalse;
    case 'X': return !isxdigit(c)?SQTrue:SQFalse;
    case 'c': return iscntrl(c)?SQTrue:SQFalse;
    case 'C': return !iscntrl(c)?SQTrue:SQFalse;
    case 'p': return ispunct(c)?SQTrue:SQFalse;
    case 'P': return !ispunct(c)?SQTrue:SQFalse;
    case 'l': return islower(c)?SQTrue:SQFalse;
    case 'u': return isupper(c)?SQTrue:SQFalse;
    }
    return SQFalse; /*cannot happen*/
}